

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

QPDF_ERROR_CODE
qpdf_write_json(qpdf_data qpdf,int version,qpdf_write_fn_t fn,void *udata,
               qpdf_stream_decode_level_e decode_level,qpdf_json_stream_data_e json_stream_data,
               char *file_prefix,char **wanted_objects)

{
  Pl_Function *pPVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  QPDF_ERROR_CODE QVar3;
  char *__s;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<Pl_Function> p;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  wanted_objects_set;
  allocator<char> local_dd;
  int local_dc;
  qpdf_stream_decode_level_e local_d8;
  qpdf_json_stream_data_e local_d4;
  Pl_Function *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  qpdf_data local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  void *local_70;
  qpdf_write_fn_t local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl._0_8_ = 0;
  local_d0 = (Pl_Function *)0x0;
  local_dc = version;
  local_d8 = decode_level;
  local_d4 = json_stream_data;
  local_c0 = qpdf;
  local_70 = udata;
  local_68 = fn;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Pl_Function,std::allocator<Pl_Function>,char_const(&)[11],decltype(nullptr),int(*&)(char_const*,unsigned_long,void*),void*&>
            (&local_c8,&local_d0,(allocator<Pl_Function> *)&local_90,(char (*) [11])"write_json",
             (void **)&local_60,(_func_int_char_ptr_unsigned_long_void_ptr **)&local_68,&local_70);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((wanted_objects != (char **)0x0) && (__s = *wanted_objects, __s != (char *)0x0)) {
    do {
      wanted_objects = wanted_objects + 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_dd);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_60,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      __s = *wanted_objects;
    } while (__s != (char *)0x0);
  }
  _Var2._M_pi = local_c8._M_pi;
  pPVar1 = local_d0;
  if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c8._M_pi)->_M_use_count = (local_c8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c8._M_pi)->_M_use_count = (local_c8._M_pi)->_M_use_count + 1;
    }
  }
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(0x30);
  *(int *)local_b8._M_unused._0_8_ = local_dc;
  *(Pl_Function **)((long)local_b8._M_unused._0_8_ + 8) = pPVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b8._M_unused._0_8_ + 0x10) =
       _Var2._M_pi;
  *(qpdf_stream_decode_level_e *)((long)local_b8._M_unused._0_8_ + 0x18) = local_d8;
  *(qpdf_json_stream_data_e *)((long)local_b8._M_unused._0_8_ + 0x1c) = local_d4;
  *(char **)((long)local_b8._M_unused._0_8_ + 0x20) = file_prefix;
  *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)((long)local_b8._M_unused._0_8_ + 0x28) = &local_60;
  pcStack_a0 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1955:9)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1955:9)>
             ::_M_manager;
  QVar3 = trap_errors(local_c0,(function<void_(_qpdf_data_*)> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
  }
  return QVar3;
}

Assistant:

QPDF_ERROR_CODE
qpdf_write_json(
    qpdf_data qpdf,
    int version,
    qpdf_write_fn_t fn,
    void* udata,
    enum qpdf_stream_decode_level_e decode_level,
    enum qpdf_json_stream_data_e json_stream_data,
    char const* file_prefix,
    char const* const* wanted_objects)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    auto p = std::make_shared<Pl_Function>("write_json", nullptr, fn, udata);
    std::set<std::string> wanted_objects_set;
    if (wanted_objects) {
        for (auto i = wanted_objects; *i; ++i) {
            wanted_objects_set.insert(*i);
        }
    }
    status = trap_errors(
        qpdf,
        [version, p, decode_level, json_stream_data, file_prefix, &wanted_objects_set](
            qpdf_data q) {
            q->qpdf->writeJSON(
                version, p.get(), decode_level, json_stream_data, file_prefix, wanted_objects_set);
        });
    return status;
}